

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

uint * __thiscall cimg_library::CImg<unsigned_int>::min(CImg<unsigned_int> *this)

{
  uint *puVar1;
  bool bVar2;
  uint *puVar3;
  CImgInstanceException *this_00;
  uint *ptrs;
  uint *puVar4;
  uint uVar5;
  char *pcVar6;
  
  bVar2 = is_empty(this);
  if (bVar2) {
    this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
    pcVar6 = "non-";
    if (this->_is_shared != false) {
      pcVar6 = "";
    }
    CImgInstanceException::CImgInstanceException
              (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::min(): Empty instance.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar6,"unsigned int");
    __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgException::~CImgException);
  }
  puVar3 = this->_data;
  uVar5 = *puVar3;
  puVar1 = puVar3 + (ulong)this->_spectrum * (ulong)this->_depth *
                    (ulong)this->_height * (ulong)this->_width;
  for (puVar4 = puVar3; puVar4 < puVar1; puVar4 = puVar4 + 1) {
    if (*puVar4 < uVar5) {
      puVar3 = puVar4;
      uVar5 = *puVar4;
    }
  }
  return puVar3;
}

Assistant:

const T& min() const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_min = _data;
      T min_value = *ptr_min;
      cimg_for(*this,ptrs,T) if (*ptrs<min_value) min_value = *(ptr_min=ptrs);
      return *ptr_min;
    }